

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_shrinkstack(lua_State *L)

{
  StkIdRel *pSVar1;
  int iVar2;
  StkId pSVar3;
  CallInfo *pCVar4;
  int iVar5;
  int iVar6;
  
  pCVar4 = L->ci;
  pSVar3 = (L->top).p;
  while (pCVar4 != (CallInfo *)0x0) {
    pSVar1 = &pCVar4->top;
    pCVar4 = pCVar4->previous;
    if (pSVar3 < pSVar1->p) {
      pSVar3 = pSVar1->p;
    }
  }
  iVar2 = (int)((ulong)((long)pSVar3 - (L->stack).offset) >> 4);
  iVar5 = 0x13;
  if (0x13 < iVar2) {
    iVar5 = iVar2;
  }
  if (iVar2 < 1000000) {
    iVar6 = (iVar5 + 1) * 3;
    if (0x51614 < iVar2) {
      iVar6 = 1000000;
    }
    if (iVar6 < (int)((ulong)((long)(L->stack_last).p - (L->stack).offset) >> 4)) {
      iVar5 = (iVar5 + 1) * 2;
      if (499999 < iVar2) {
        iVar5 = 1000000;
      }
      luaD_reallocstack(L,iVar5,0);
    }
  }
  luaE_shrinkCI(L);
  return;
}

Assistant:

void luaD_shrinkstack (lua_State *L) {
  int inuse = stackinuse(L);
  int max = (inuse > LUAI_MAXSTACK / 3) ? LUAI_MAXSTACK : inuse * 3;
  /* if thread is currently not handling a stack overflow and its
     size is larger than maximum "reasonable" size, shrink it */
  if (inuse <= LUAI_MAXSTACK && stacksize(L) > max) {
    int nsize = (inuse > LUAI_MAXSTACK / 2) ? LUAI_MAXSTACK : inuse * 2;
    luaD_reallocstack(L, nsize, 0);  /* ok if that fails */
  }
  else  /* don't change stack */
    condmovestack(L,{},{});  /* (change only for debugging) */
  luaE_shrinkCI(L);  /* shrink CI list */
}